

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,-1,int>>::operator=
          (PermutationBase<Eigen::PermutationMatrix<_1,_1,int>> *this,
          TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *tr)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::setIdentity
            ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this,*(Index *)(tr + 8));
  if (0 < (int)(uint)*(undefined8 *)(this + 8)) {
    uVar3 = (ulong)((uint)*(undefined8 *)(this + 8) & 0x7fffffff);
    do {
      uVar2 = uVar3 - 1;
      PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::applyTranspositionOnTheRight
                ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this,(Index)uVar2,
                 *(Index *)(*(long *)tr + uVar2 * 4));
      bVar1 = 1 < uVar3;
      uVar3 = uVar2;
    } while (bVar1);
  }
  return (PermutationMatrix<_1,__1,_int> *)this;
}

Assistant:

Derived& operator=(const TranspositionsBase<OtherDerived>& tr)
    {
      setIdentity(tr.size());
      for(Index k=size()-1; k>=0; --k)
        applyTranspositionOnTheRight(k,tr.coeff(k));
      return derived();
    }